

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::EndPlot(void)

{
  ImPlotAxis *axis;
  ImPlotAxis *axis_00;
  ImPlotTickCollection *ticks;
  ImRect *outer_rect;
  ImPool<ImPlotItem> *this;
  ImVec2 *pIVar1;
  ImVec2 *spacing;
  ImVec2 *p_max;
  double *pdVar2;
  float fVar3;
  float fVar4;
  ImPlotPlot *plot;
  ImDrawList *DrawList;
  ImPlotContext *pIVar5;
  ImVec4 IVar6;
  byte bVar7;
  bool bVar8;
  int c;
  uint uVar9;
  ImU32 IVar10;
  ImPlotTimeUnit idx;
  ImU32 col;
  ImGuiIO *pIVar11;
  ImPlotTick *pIVar12;
  char *pcVar13;
  ImPlotAnnotation *p1;
  ulong uVar14;
  ImPlotItem *pIVar15;
  long lVar16;
  ImPlotRange *pIVar17;
  int t;
  int iVar18;
  int iVar19;
  ImPlotAxis *pIVar20;
  ImPlotAxis *equal_axis;
  ImRect *pIVar21;
  undefined8 in_R9;
  int i_3;
  bool *pbVar22;
  int i;
  int i_1;
  ImPlotTickCollection *ticks_00;
  ImPlotTime *t_00;
  int i_2;
  char (*pacVar23) [16];
  ulong uVar24;
  ImVec2 IVar25;
  ImVec2 IVar26;
  double dVar27;
  double dVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar35;
  ImVec2 IVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar36;
  double dVar37;
  float fVar38;
  ImPlotTime IVar39;
  ImPlotDateTimeFmt IVar40;
  ImPlotDateTimeFmt fmt;
  ImRect rect;
  undefined8 local_148;
  float local_108;
  float fStack_104;
  ImVec2 h3;
  ImVec2 start;
  float fStack_e0;
  float fStack_dc;
  ImVec2 h4;
  ImVec2 v3;
  ImVec2 v1;
  ImVec2 v4;
  ImVec2 v2;
  
  pIVar5 = GImPlot;
  if (GImPlot == (ImPlotContext *)0x0) {
    __assert_fail("(GImPlot != __null) && \"No current context. Did you call ImPlot::CreateContext() or ImPlot::SetCurrentContext()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0x8b6,"void ImPlot::EndPlot()");
  }
  plot = GImPlot->CurrentPlot;
  if (plot == (ImPlotPlot *)0x0) {
    __assert_fail("(gp.CurrentPlot != __null) && \"Mismatched BeginPlot()/EndPlot()!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0x8b8,"void ImPlot::EndPlot()");
  }
  DrawList = GImGui->CurrentWindow->DrawList;
  pIVar11 = ImGui::GetIO();
  bVar7 = 1;
  if ((plot->YAxis[0].Dragging == false) && (plot->YAxis[1].Dragging == false)) {
    bVar7 = plot->YAxis[2].Dragging;
  }
  PushPlotClipRect((float)(-(uint)((pIVar5->Style).PlotBorderSize == 0.0) & 0x3f800000));
  if (((plot->XAxis).Flags & 0x12U) == 0x10) {
    IVar10 = (plot->XAxis).ColorMaj;
    RenderGridLinesX(DrawList,&pIVar5->XTicks,&plot->PlotRect,IVar10,IVar10,
                     (pIVar5->Style).MajorGridSize.x,(pIVar5->Style).MinorGridSize.x);
  }
  axis_00 = plot->YAxis;
  axis = &plot->XAxis;
  ticks = pIVar5->YTicks;
  outer_rect = &plot->PlotRect;
  ticks_00 = ticks;
  for (lVar16 = 0xf0; lVar16 != 0x270; lVar16 = lVar16 + 0x80) {
    if ((*(char *)((long)plot + lVar16 + -0x3d) == '\x01') &&
       ((*(uint *)((long)plot + lVar16 + -0x60) & 0x12) == 0x10)) {
      RenderGridLinesY(DrawList,ticks_00,outer_rect,*(ImU32 *)((long)plot + lVar16 + -4),
                       *(ImU32 *)((long)&plot->ID + lVar16),(pIVar5->Style).MajorGridSize.y,
                       (pIVar5->Style).MinorGridSize.y);
    }
    ticks_00 = ticks_00 + 1;
  }
  ImGui::PopClipRect();
  PushPlotClipRect(0.0);
  if ((axis->Flags & 4) == 0) {
    for (iVar18 = 0; iVar18 < (pIVar5->XTicks).Size; iVar18 = iVar18 + 1) {
      pIVar12 = ImVector<ImPlotTick>::operator[](&(pIVar5->XTicks).Ticks,iVar18);
      if (pIVar12->Level == 0) {
        rect.Min.x = pIVar12->PixelPos;
        fVar31 = (plot->PlotRect).Max.y;
        start.y = fVar31;
        start.x = rect.Min.x;
        uVar9 = pIVar12->Major ^ 1;
        rect.Min.y = fVar31 - ((ImVec2 *)((pIVar5->Style).Colors + -8))[uVar9].x;
        ImDrawList::AddLine(DrawList,&start,&rect.Min,(plot->XAxis).ColorMaj,
                            ((ImVec2 *)((pIVar5->Style).Colors + -7))[uVar9].x);
      }
    }
  }
  ImGui::PopClipRect();
  start.y = (plot->PlotRect).Max.y;
  start.x = (plot->FrameRect).Max.x;
  ImGui::PushClipRect(&outer_rect->Min,&start,true);
  iVar18 = 0;
  for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
    if (plot->YAxis[lVar16].Present == true) {
      fVar31 = pIVar5->YAxisReference[lVar16];
      if ((axis_00[lVar16].Flags & 4) == 0) {
        for (iVar19 = 0; iVar19 < (&ticks[lVar16].Ticks)[3].Capacity; iVar19 = iVar19 + 1) {
          pIVar12 = ImVector<ImPlotTick>::operator[](&ticks[lVar16].Ticks,iVar19);
          start.y = pIVar12->PixelPos;
          start.x = fVar31;
          if ((1 < iVar18) || (pIVar1 = &(pIVar5->Style).MajorTickLen, pIVar12->Major == false)) {
            pIVar1 = &(pIVar5->Style).MinorTickLen;
          }
          fVar29 = pIVar1->y;
          if (lVar16 != 0) {
            fVar29 = -fVar29;
          }
          rect.Min.x = fVar31 + fVar29;
          rect.Min.y = pIVar12->PixelPos + 0.0;
          if ((1 < iVar18) || (pIVar1 = &(pIVar5->Style).MajorTickSize, pIVar12->Major == false)) {
            pIVar1 = &(pIVar5->Style).MinorTickSize;
          }
          ImDrawList::AddLine(DrawList,&start,&rect.Min,axis_00[lVar16].ColorMaj,pIVar1->y);
        }
      }
      iVar19 = iVar18 + 1;
      bVar8 = 1 < iVar18;
      iVar18 = iVar19;
      if (bVar8) {
        start.y = (plot->PlotRect).Min.y;
        start.x = fVar31;
        rect.Min.y = (plot->PlotRect).Max.y;
        rect.Min.x = fVar31;
        IVar10 = GetStyleColorU32(0x14);
        ImDrawList::AddLine(DrawList,&start,&rect.Min,IVar10,1.0);
      }
    }
  }
  ImGui::PopClipRect();
  PushPlotClipRect(0.0);
  for (iVar18 = 0; iVar18 < (pIVar5->Annotations).Size; iVar18 = iVar18 + 1) {
    pcVar13 = ImPlotAnnotationCollection::GetText(&pIVar5->Annotations,iVar18);
    p1 = ImVector<ImPlotAnnotation>::operator[](&(pIVar5->Annotations).Annotations,iVar18);
    IVar25 = ImGui::CalcTextSize(pcVar13,(char *)0x0,false,-1.0);
    IVar26 = (pIVar5->Style).AnnotationPadding;
    fVar29 = IVar26.x;
    fVar31 = IVar26.y;
    fVar30 = fVar29 + fVar29 + IVar25.x;
    fVar35 = fVar31 + fVar31 + IVar25.y;
    fVar29 = (p1->Pos).x;
    fVar38 = (p1->Pos).y;
    fVar31 = (p1->Offset).x;
    if ((fVar31 != 0.0) || (NAN(fVar31))) {
      if (fVar31 <= 0.0) {
        fVar29 = fVar29 - (fVar30 - fVar31);
      }
      else {
        fVar29 = fVar29 + fVar31;
      }
    }
    else {
      fVar29 = fVar30 * -0.5 + fVar29;
    }
    fVar3 = (p1->Offset).y;
    if ((fVar3 != 0.0) || (NAN(fVar3))) {
      if (fVar3 <= 0.0) {
        fVar38 = fVar38 - (fVar35 - fVar3);
      }
      else {
        fVar38 = fVar38 + fVar3;
      }
    }
    else {
      fVar38 = fVar38 + fVar35 * -0.5;
    }
    if (p1->Clamp == true) {
      fVar4 = (plot->PlotRect).Min.x;
      if (fVar29 < fVar4) {
        fVar29 = fVar4;
      }
      fVar4 = (plot->PlotRect).Min.y;
      if (fVar38 < fVar4) {
        fVar38 = fVar4;
      }
      fVar4 = (plot->PlotRect).Max.x;
      if (fVar4 < fVar30 + fVar29) {
        fVar29 = fVar4 - fVar30;
      }
      fVar4 = (plot->PlotRect).Max.y;
      if (fVar4 < fVar35 + fVar38) {
        fVar38 = fVar4 - fVar35;
      }
    }
    rect.Max.x = fVar30 + fVar29;
    rect.Max.y = fVar35 + fVar38;
    rect.Min.x = fVar29;
    rect.Min.y = fVar38;
    if ((((fVar31 != 0.0) || (NAN(fVar31))) || (fVar3 != 0.0)) || (NAN(fVar3))) {
      fStack_e0 = rect.Max.x;
      start.x = fVar29;
      start.y = fVar38;
      fStack_dc = fVar38;
      fVar31 = 3.4028235e+38;
      uVar24 = 0;
      for (uVar14 = 0; uVar14 != 4; uVar14 = uVar14 + 1) {
        fVar30 = (p1->Pos).x - (&start)[uVar14].x;
        fVar35 = (p1->Pos).y - (&start)[uVar14].y;
        fVar30 = fVar30 * fVar30 + fVar35 * fVar35;
        if (fVar30 < fVar31) {
          uVar24 = uVar14 & 0xffffffff;
          fVar31 = fVar30;
        }
      }
      ImDrawList::AddLine(DrawList,&p1->Pos,&start + (int)uVar24,p1->ColorBg,1.0);
    }
    ImDrawList::AddRectFilled(DrawList,&rect.Min,&rect.Max,p1->ColorBg,0.0,0);
    IVar6 = _start;
    IVar26 = (pIVar5->Style).AnnotationPadding;
    start.y = fVar38 + IVar26.y;
    start.x = fVar29 + IVar26.x;
    _fStack_e0 = IVar6._8_8_;
    ImDrawList::AddText(DrawList,&start,p1->ColorFg,pcVar13,(char *)0x0);
  }
  if (plot->Selected != false) {
    IVar26 = (plot->SelectRect).Min;
    IVar25 = (plot->PlotRect).Min;
    fVar31 = IVar25.x;
    rect.Min.x = IVar26.x + fVar31;
    fVar29 = IVar25.y;
    rect.Min.y = IVar26.y + fVar29;
    IVar26 = (plot->SelectRect).Max;
    h3.x = IVar26.x + fVar31;
    h3.y = IVar26.y + fVar29;
    _start = GetStyleColorVec4(0x15);
    RenderSelectionRect(DrawList,&rect.Min,&h3,(ImVec4 *)&start);
  }
  if (plot->Queried == true) {
    IVar26 = (plot->QueryRect).Min;
    IVar25 = (plot->PlotRect).Min;
    fVar31 = IVar25.x;
    rect.Min.x = IVar26.x + fVar31;
    fVar29 = IVar25.y;
    rect.Min.y = IVar26.y + fVar29;
    IVar26 = (plot->QueryRect).Max;
    h3.x = IVar26.x + fVar31;
    h3.y = IVar26.y + fVar29;
    _start = GetStyleColorVec4(0x16);
    RenderSelectionRect(DrawList,&rect.Min,&h3,(ImVec4 *)&start);
  }
  uVar9 = plot->Flags;
  if (((((uVar9 >> 0xb & 1) != 0) && (plot->PlotHovered == true)) &&
      ((((bVar7 | (plot->XAxis).Dragging) & 1) == 0 &&
       ((plot->Selecting == false && (plot->Querying == false)))))) &&
     (plot->LegendHovered == false)) {
    ImGui::SetMouseCursor(-1);
    v3.x = (pIVar11->MousePos).x;
    rect.Min.y = (pIVar11->MousePos).y;
    start.y = rect.Min.y;
    start.x = (plot->PlotRect).Min.x;
    rect.Min.x = v3.x + -5.0;
    h3.y = rect.Min.y;
    h3.x = v3.x + 5.0;
    h4.y = rect.Min.y;
    h4.x = (plot->PlotRect).Max.x;
    v1.y = (plot->PlotRect).Min.y;
    v2.y = rect.Min.y + -5.0;
    v3.y = rect.Min.y + 5.0;
    v4.y = (plot->PlotRect).Max.y;
    v1.x = v3.x;
    v4.x = v3.x;
    v2.x = v3.x;
    IVar10 = GetStyleColorU32(0x17);
    ImDrawList::AddLine(DrawList,&start,&rect.Min,IVar10,1.0);
    ImDrawList::AddLine(DrawList,&h3,&h4,IVar10,1.0);
    ImDrawList::AddLine(DrawList,&v1,&v2,IVar10,1.0);
    ImDrawList::AddLine(DrawList,&v3,&v4,IVar10,1.0);
    uVar9 = plot->Flags;
  }
  IVar26.y = rect.Min.y;
  IVar26.x = rect.Min.x;
  if (((uVar9 & 0x10) == 0) && (rect.Min = IVar26, plot->PlotHovered == true)) {
    _start = (ImVec4)ZEXT816(0);
    rect.Min = (ImVec2)&start;
    rect.Max.x = 1.79366e-43;
    rect.Max.y = 0.0;
    if ((axis->Flags & 0x40) == 0) {
      pcVar13 = (GImPlot->NextPlotData).FmtX;
      if ((GImPlot->NextPlotData).HasFmtX == false) {
        pcVar13 = "%g";
      }
      RoundAxisValue(axis,&pIVar5->XTicks,pIVar5->MousePos[0].x);
      ImBufferWriter::Write((ImBufferWriter *)&rect,pcVar13);
    }
    else {
      idx = GetUnitForRange(((plot->XAxis).Range.Max - (plot->XAxis).Range.Min) /
                            (double)(((plot->PlotRect).Max.x - (plot->PlotRect).Min.x) / 100.0));
      IVar39 = ImPlotTime::FromDouble(pIVar5->MousePos[0].x);
      h3 = (ImVec2)IVar39.S;
      t_00 = (ImPlotTime *)((long)(int)rect.Max.y + (long)rect.Min);
      uVar9 = ~(uint)rect.Max.y + (int)rect.Max.x;
      IVar40 = GetDateTimeFmt((ImPlotDateTimeFmt *)TimeFormatMouseCursor,idx);
      fmt.Date = IVar40._8_4_ & 0xffff;
      fmt.Time = 0;
      fmt._8_4_ = (undefined4)in_R9;
      iVar18 = FormatDateTime((ImPlot *)&h3,t_00,(char *)(ulong)uVar9,IVar40.Date,fmt);
      if (0 < iVar18) {
        iVar19 = ~(uint)rect.Max.y + (int)rect.Max.x;
        if (iVar18 < (int)(~(uint)rect.Max.y + (int)rect.Max.x)) {
          iVar19 = iVar18;
        }
        rect.Max.y = (float)(iVar19 + (int)rect.Max.y);
      }
    }
    ImBufferWriter::Write((ImBufferWriter *)&rect,", ");
    pacVar23 = (GImPlot->NextPlotData).FmtY;
    if ((GImPlot->NextPlotData).HasFmtY[0] == false) {
      pacVar23 = (char (*) [16])0x27b224;
    }
    RoundAxisValue(axis_00,ticks,pIVar5->MousePos[0].y);
    ImBufferWriter::Write((ImBufferWriter *)&rect,*pacVar23);
    uVar9 = plot->Flags;
    if ((uVar9 >> 8 & 1) != 0) {
      ImBufferWriter::Write((ImBufferWriter *)&rect,", (");
      pacVar23 = (GImPlot->NextPlotData).FmtY + 1;
      if ((GImPlot->NextPlotData).HasFmtY[1] == false) {
        pacVar23 = (char (*) [16])0x27b224;
      }
      RoundAxisValue(plot->YAxis + 1,pIVar5->YTicks + 1,pIVar5->MousePos[1].y);
      ImBufferWriter::Write((ImBufferWriter *)&rect,*pacVar23);
      ImBufferWriter::Write((ImBufferWriter *)&rect,")");
      uVar9 = plot->Flags;
    }
    if ((uVar9 >> 9 & 1) != 0) {
      ImBufferWriter::Write((ImBufferWriter *)&rect,", (");
      pacVar23 = (char (*) [16])0x27b224;
      if ((GImPlot->NextPlotData).HasFmtY[2] != false) {
        pacVar23 = (GImPlot->NextPlotData).FmtY + 2;
      }
      RoundAxisValue(plot->YAxis + 2,pIVar5->YTicks + 2,pIVar5->MousePos[2].y);
      ImBufferWriter::Write((ImBufferWriter *)&rect,*pacVar23);
      ImBufferWriter::Write((ImBufferWriter *)&rect,")");
    }
    h3 = ImGui::CalcTextSize((char *)&start,(char *)0x0,false,-1.0);
    h4 = GetLocationPos(outer_rect,&h3,plot->MousePosLocation,&(pIVar5->Style).MousePosPadding);
    IVar10 = GetStyleColorU32(0xc);
    ImDrawList::AddText(DrawList,&h4,IVar10,(char *)&start,(char *)0x0);
  }
  ImGui::PopClipRect();
  plot->LegendHovered = false;
  this = &plot->Items;
  iVar18 = 0;
  while( true ) {
    iVar19 = ImPool<ImPlotItem>::GetBufSize(this);
    if (iVar19 <= iVar18) break;
    pIVar15 = ImVector<ImPlotItem>::operator[](&this->Buf,iVar18);
    pIVar15->LegendHovered = false;
    iVar18 = iVar18 + 1;
  }
  if (((plot->Flags & 2) == 0) && (0 < (plot->LegendData).Indices.Size)) {
    pIVar1 = &(pIVar5->Style).LegendInnerPadding;
    spacing = &(pIVar5->Style).LegendSpacing;
    IVar26 = CalcLegendSize(plot,pIVar1,spacing,plot->LegendOrientation);
    start = IVar26;
    pIVar21 = outer_rect;
    if (plot->LegendOutside != false) {
      pIVar21 = &plot->FrameRect;
    }
    IVar25 = GetLocationPos(pIVar21,&start,plot->LegendLocation,
                            (ImVec2 *)
                            ((long)&((ImVec2 *)((pIVar5->Style).Colors + -5))->x +
                            (ulong)((plot->LegendOutside ^ 1) << 4)));
    local_108 = IVar26.x;
    fStack_104 = IVar26.y;
    IVar32.x = local_108 + IVar25.x;
    IVar32.y = fStack_104 + IVar25.y;
    pIVar21 = &plot->LegendRect;
    (plot->LegendRect).Min = IVar25;
    (plot->LegendRect).Max = IVar32;
    if (plot->FrameHovered == true) {
      bVar8 = ImRect::Contains(pIVar21,&pIVar11->MousePos);
    }
    else {
      bVar8 = false;
    }
    p_max = &(plot->LegendRect).Max;
    plot->LegendHovered = bVar8;
    if (plot->LegendOutside == true) {
      ImGui::PushClipRect(&(plot->FrameRect).Min,&(plot->FrameRect).Max,true);
    }
    else {
      PushPlotClipRect(0.0);
    }
    IVar10 = GetStyleColorU32(8);
    col = GetStyleColorU32(9);
    ImDrawList::AddRectFilled(DrawList,&pIVar21->Min,p_max,IVar10,0.0,0);
    ImDrawList::AddRect(DrawList,&pIVar21->Min,p_max,col,0.0,0,1.0);
    ShowLegendEntries(plot,pIVar21,plot->LegendHovered,pIVar1,spacing,plot->LegendOrientation,
                      DrawList);
    ImGui::PopClipRect();
  }
  else {
    (plot->LegendRect).Min.x = 0.0;
    (plot->LegendRect).Min.y = 0.0;
    (plot->LegendRect).Max.x = 0.0;
    (plot->LegendRect).Max.y = 0.0;
  }
  if (plot->LegendFlipSideNextFrame == true) {
    plot->LegendOutside = (bool)(plot->LegendOutside ^ 1);
    plot->LegendFlipSideNextFrame = false;
  }
  if (0.0 < (pIVar5->Style).PlotBorderSize) {
    IVar10 = GetStyleColorU32(7);
    ImDrawList::AddRect(DrawList,&outer_rect->Min,&(plot->PlotRect).Max,IVar10,0.0,0xf0,
                        (pIVar5->Style).PlotBorderSize);
  }
  if ((pIVar5->FitThisFrame == true) && ((0 < pIVar5->VisibleItemCount || (plot->Queried == true))))
  {
    local_148._0_1_ = (char)plot->Flags;
    if (pIVar5->FitX == true) {
      dVar27 = (double)(pIVar5->Style).FitPadding.x;
      dVar28 = (pIVar5->ExtentsX).Min;
      dVar37 = (pIVar5->ExtentsX).Max;
      dVar36 = (dVar37 - dVar28) * 0.5;
      (pIVar5->ExtentsX).Min = dVar27 * -dVar36 + dVar28;
      (pIVar5->ExtentsX).Max = dVar27 * dVar36 + dVar37;
      bVar8 = ImPlotAxis::IsLockedMin(axis);
      if ((!bVar8) && (dVar28 = (pIVar5->ExtentsX).Min, (ulong)ABS(dVar28) < 0x7ff0000000000000)) {
        (plot->XAxis).Range.Min = dVar28;
      }
      bVar8 = ImPlotAxis::IsLockedMax(axis);
      if ((!bVar8) && (dVar28 = (pIVar5->ExtentsX).Max, (ulong)ABS(dVar28) < 0x7ff0000000000000)) {
        (plot->XAxis).Range.Max = dVar28;
      }
      dVar28 = (plot->XAxis).Range.Min;
      dVar37 = (plot->XAxis).Range.Max;
      if ((ABS(dVar37 - dVar28) < 2.2250738585072014e-308) ||
         (dVar27 = ABS(dVar37 + dVar28) * 2.220446049250313e-16,
         ABS(dVar37 - dVar28) < dVar27 + dVar27)) {
        (plot->XAxis).Range.Min = dVar28 + -0.5;
        (plot->XAxis).Range.Max = dVar37 + 0.5;
      }
      ImPlotAxis::Constrain(axis);
      if (((char)local_148 < '\0') && (pIVar5->FitY[0] == false)) {
        ImPlotAxis::SetAspect
                  (axis_00,((plot->XAxis).Range.Max - (plot->XAxis).Range.Min) /
                           (double)(plot->XAxis).Pixels);
      }
    }
    pIVar17 = pIVar5->ExtentsY;
    pbVar22 = pIVar5->FitY;
    for (lVar16 = 0; lVar16 != 0x180; lVar16 = lVar16 + 0x80) {
      if (*pbVar22 == true) {
        dVar28 = (double)(pIVar5->Style).FitPadding.y;
        dVar37 = (pIVar17->Max - pIVar17->Min) * 0.5;
        pIVar17->Min = dVar28 * -dVar37 + pIVar17->Min;
        pIVar17->Max = dVar28 * dVar37 + pIVar17->Max;
        pIVar20 = (ImPlotAxis *)((long)&plot->YAxis[0].Flags + lVar16);
        bVar8 = ImPlotAxis::IsLockedMin(pIVar20);
        if ((!bVar8) && ((ulong)ABS(pIVar17->Min) < 0x7ff0000000000000)) {
          *(double *)((long)&plot->YAxis[0].Range.Min + lVar16) = pIVar17->Min;
        }
        bVar8 = ImPlotAxis::IsLockedMax(pIVar20);
        if ((!bVar8) && ((ulong)ABS(pIVar17->Max) < 0x7ff0000000000000)) {
          *(double *)((long)&plot->YAxis[0].Range.Max + lVar16) = pIVar17->Max;
        }
        pdVar2 = (double *)((long)&plot->YAxis[0].Range.Min + lVar16);
        dVar28 = *pdVar2;
        dVar37 = pdVar2[1];
        dVar27 = ABS(dVar37 + dVar28) * 2.220446049250313e-16;
        if ((ABS(dVar37 - dVar28) < 2.2250738585072014e-308) ||
           (ABS(dVar37 - dVar28) < dVar27 + dVar27)) {
          pdVar2 = (double *)((long)&plot->YAxis[0].Range.Min + lVar16);
          *pdVar2 = dVar28 + -0.5;
          pdVar2[1] = dVar37 + 0.5;
        }
        ImPlotAxis::Constrain(pIVar20);
        if ((lVar16 == 0 && (char)local_148 < '\0') && (pIVar5->FitX == false)) {
          ImPlotAxis::SetAspect
                    (axis,(plot->YAxis[0].Range.Max - plot->YAxis[0].Range.Min) /
                          (double)plot->YAxis[0].Pixels);
        }
      }
      pIVar17 = pIVar17 + 1;
      pbVar22 = pbVar22 + 1;
    }
    if ((((char)local_148 < '\0') && (pIVar5->FitX == true)) && (pIVar5->FitY[0] == true)) {
      auVar33._0_8_ = (plot->XAxis).Range.Max - (plot->XAxis).Range.Min;
      auVar33._8_8_ = plot->YAxis[0].Range.Max - plot->YAxis[0].Range.Min;
      auVar34._0_8_ = (double)(plot->XAxis).Pixels;
      auVar34._8_8_ = (double)plot->YAxis[0].Pixels;
      auVar34 = divpd(auVar33,auVar34);
      uVar24 = -(ulong)(auVar34._8_8_ <= auVar34._0_8_);
      dVar28 = (double)(~uVar24 & (ulong)auVar34._8_8_ | (ulong)auVar34._0_8_ & uVar24);
      ImPlotAxis::SetAspect(axis,dVar28);
      ImPlotAxis::SetAspect(axis_00,dVar28);
    }
  }
  if ((((plot->Flags & 4) == 0) && (plot->PlotHovered == true)) &&
     ((pIVar11->MouseReleased[(pIVar5->InputMap).ContextMenuButton] == true &&
      ((plot->LegendHovered == false && (plot->ContextLocked == false)))))) {
    ImGui::OpenPopup("##PlotContext",0);
  }
  bVar8 = ImGui::BeginPopup("##PlotContext",0);
  if (bVar8) {
    ShowPlotContextMenu(plot);
    ImGui::EndPopup();
  }
  if ((((((plot->Flags & 4) == 0) && (plot->FrameHovered == true)) &&
       ((plot->XAxis).ExtHovered == true)) &&
      ((pIVar11->MouseReleased[(pIVar5->InputMap).ContextMenuButton] == true &&
       (plot->LegendHovered == false)))) && (plot->ContextLocked == false)) {
    ImGui::OpenPopup("##XContext",0);
  }
  bVar8 = ImGui::BeginPopup("##XContext",0);
  if (bVar8) {
    ImGui::Text("X-Axis");
    ImGui::Separator();
    pIVar20 = (ImPlotAxis *)0x0;
    if ((char)plot->Flags < '\0') {
      pIVar20 = axis_00;
    }
    ShowAxisContextMenu(axis,pIVar20,true);
    ImGui::EndPopup();
  }
  lVar16 = 0;
  pIVar20 = axis_00;
  do {
    if (lVar16 == 3) {
      PushLinkedAxis(axis);
      for (lVar16 = 0; lVar16 != 0x180; lVar16 = lVar16 + 0x80) {
        PushLinkedAxis((ImPlotAxis *)((long)&axis_00->Flags + lVar16));
      }
      if ((plot->ContextLocked != false) &&
         (pIVar11->MouseReleased[(pIVar5->InputMap).BoxSelectButton] == true)) {
        plot->ContextLocked = false;
      }
      iVar18 = 0;
      while( true ) {
        iVar19 = ImPool<ImPlotItem>::GetBufSize(this);
        if (iVar19 <= iVar18) break;
        pIVar15 = ImVector<ImPlotItem>::operator[](&this->Buf,iVar18);
        pIVar15->SeenThisFrame = false;
        iVar18 = iVar18 + 1;
      }
      plot->Initialized = true;
      ImGui::PopID();
      Reset(GImPlot);
      return;
    }
    ImGui::PushID((int)lVar16);
    if (((((plot->Flags & 4) == 0) && (plot->FrameHovered == true)) && (pIVar20->ExtHovered == true)
        ) && (((pIVar11->MouseReleased[(pIVar5->InputMap).ContextMenuButton] == true &&
               (plot->LegendHovered == false)) && (plot->ContextLocked == false)))) {
      ImGui::OpenPopup("##YContext",0);
    }
    bVar8 = ImGui::BeginPopup("##YContext",0);
    if (bVar8) {
      if (lVar16 == 0) {
        ImGui::Text("Y-Axis");
        ImGui::Separator();
        equal_axis = axis;
        if ((plot->Flags & 0x80) == 0) goto LAB_001a1f85;
      }
      else {
        ImGui::Text("Y-Axis %d");
        ImGui::Separator();
LAB_001a1f85:
        equal_axis = (ImPlotAxis *)0x0;
      }
      ShowAxisContextMenu(pIVar20,equal_axis,false);
      ImGui::EndPopup();
    }
    ImGui::PopID();
    lVar16 = lVar16 + 1;
    pIVar20 = pIVar20 + 1;
  } while( true );
}

Assistant:

void EndPlot() {
    IM_ASSERT_USER_ERROR(GImPlot != NULL, "No current context. Did you call ImPlot::CreateContext() or ImPlot::SetCurrentContext()?");
    ImPlotContext& gp     = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "Mismatched BeginPlot()/EndPlot()!");
    ImGuiContext &G       = *GImGui;
    ImPlotPlot &plot     = *gp.CurrentPlot;
    ImGuiWindow * Window  = G.CurrentWindow;
    ImDrawList & DrawList = *Window->DrawList;
    const ImGuiIO &   IO  = ImGui::GetIO();

    // AXIS STATES ------------------------------------------------------------

    const bool any_y_dragging = plot.YAxis[0].Dragging || plot.YAxis[1].Dragging || plot.YAxis[2].Dragging;

    // FINAL RENDER -----------------------------------------------------------

    // render grid (foreground)
    PushPlotClipRect(gp.Style.PlotBorderSize == 0 ? 1.0f : 0.0f);
    if (!ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_NoGridLines) && ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_Foreground))
        RenderGridLinesX(DrawList, gp.XTicks, plot.PlotRect, plot.XAxis.ColorMaj, plot.XAxis.ColorMaj, gp.Style.MajorGridSize.x, gp.Style.MinorGridSize.x);
    for (int i = 0; i < IMPLOT_Y_AXES; i++) {
        if (plot.YAxis[i].Present && !ImHasFlag(plot.YAxis[i].Flags, ImPlotAxisFlags_NoGridLines) && ImHasFlag(plot.YAxis[i].Flags, ImPlotAxisFlags_Foreground))
            RenderGridLinesY(DrawList, gp.YTicks[i], plot.PlotRect,  plot.YAxis[i].ColorMaj,  plot.YAxis[i].ColorMin, gp.Style.MajorGridSize.y, gp.Style.MinorGridSize.y);
    }
    PopPlotClipRect();

    // render x-ticks
    PushPlotClipRect();
    if (!ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_NoTickMarks)) {
        for (int t = 0; t < gp.XTicks.Size; t++) {
            ImPlotTick *xt = &gp.XTicks.Ticks[t];
            if (xt->Level == 0)
                DrawList.AddLine(ImVec2(xt->PixelPos, plot.PlotRect.Max.y),
                                ImVec2(xt->PixelPos, plot.PlotRect.Max.y - (xt->Major ? gp.Style.MajorTickLen.x : gp.Style.MinorTickLen.x)),
                                plot.XAxis.ColorMaj,
                                xt->Major ? gp.Style.MajorTickSize.x : gp.Style.MinorTickSize.x);
        }
    }
    PopPlotClipRect();

    // render y-ticks
    ImGui::PushClipRect(plot.PlotRect.Min, ImVec2(plot.FrameRect.Max.x, plot.PlotRect.Max.y), true);
    int axis_count = 0;
    for (int i = 0; i < IMPLOT_Y_AXES; i++) {
        if (!plot.YAxis[i].Present) { continue; }
        axis_count++;
        float x_start = gp.YAxisReference[i];
        if (!ImHasFlag(plot.YAxis[i].Flags, ImPlotAxisFlags_NoTickMarks)) {
            float direction = (i == 0) ? 1.0f : -1.0f;
            bool no_major = axis_count >= 3;
            for (int t = 0; t < gp.YTicks[i].Size; t++) {
                ImPlotTick *yt = &gp.YTicks[i].Ticks[t];
                ImVec2 start = ImVec2(x_start, yt->PixelPos);
                DrawList.AddLine(start,
                                 start + ImVec2(direction * ((!no_major && yt->Major) ? gp.Style.MajorTickLen.y : gp.Style.MinorTickLen.y), 0),
                                 plot.YAxis[i].ColorMaj,
                                 (!no_major && yt->Major) ? gp.Style.MajorTickSize.y : gp.Style.MinorTickSize.y);
            }
        }
        if (axis_count >= 3) {
            // Draw a bar next to the ticks to act as a visual separator.
            DrawList.AddLine(ImVec2(x_start, plot.PlotRect.Min.y), ImVec2(x_start, plot.PlotRect.Max.y), GetStyleColorU32(ImPlotCol_YAxisGrid3), 1);
        }
    }
    ImGui::PopClipRect();

    // render annotations
    PushPlotClipRect();
    for (int i = 0; i < gp.Annotations.Size; ++i) {
        const char* txt       = gp.Annotations.GetText(i);
        ImPlotAnnotation& an  = gp.Annotations.Annotations[i];
        const ImVec2 txt_size = ImGui::CalcTextSize(txt);
        const ImVec2 size     = txt_size + gp.Style.AnnotationPadding * 2;
        ImVec2 pos            = an.Pos;
        if (an.Offset.x == 0)
            pos.x -= size.x / 2;
        else if (an.Offset.x > 0)
            pos.x += an.Offset.x;
        else
            pos.x -= size.x - an.Offset.x;
        if (an.Offset.y == 0)
            pos.y -= size.y / 2;
        else if (an.Offset.y > 0)
            pos.y += an.Offset.y;
        else
            pos.y -= size.y - an.Offset.y;
        if (an.Clamp)
            pos = ClampLabelPos(pos, size, plot.PlotRect.Min, plot.PlotRect.Max);
        ImRect rect(pos,pos+size);
        if (an.Offset.x != 0 || an.Offset.y != 0) {
            ImVec2 corners[4] = {rect.GetTL(), rect.GetTR(), rect.GetBR(), rect.GetBL()};
            int min_corner = 0;
            float min_len = FLT_MAX;
            for (int c = 0; c < 4; ++c) {
                float len = ImLengthSqr(an.Pos - corners[c]);
                if (len < min_len) {
                    min_corner = c;
                    min_len = len;
                }
            }
            DrawList.AddLine(an.Pos, corners[min_corner], an.ColorBg);
        }
        DrawList.AddRectFilled(rect.Min, rect.Max, an.ColorBg);
        DrawList.AddText(pos + gp.Style.AnnotationPadding, an.ColorFg, txt);
    }

    // render selection
    if (plot.Selected)
        RenderSelectionRect(DrawList, plot.SelectRect.Min + plot.PlotRect.Min, plot.SelectRect.Max + plot.PlotRect.Min, GetStyleColorVec4(ImPlotCol_Selection));
    // render query
    if (plot.Queried)
        RenderSelectionRect(DrawList, plot.QueryRect.Min + plot.PlotRect.Min, plot.QueryRect.Max + plot.PlotRect.Min, GetStyleColorVec4(ImPlotCol_Query));

    // render crosshairs
    if (ImHasFlag(plot.Flags, ImPlotFlags_Crosshairs) && plot.PlotHovered && !(plot.XAxis.Dragging || any_y_dragging) && !plot.Selecting && !plot.Querying && !plot.LegendHovered) {
        ImGui::SetMouseCursor(ImGuiMouseCursor_None);
        ImVec2 xy = IO.MousePos;
        ImVec2 h1(plot.PlotRect.Min.x, xy.y);
        ImVec2 h2(xy.x - 5, xy.y);
        ImVec2 h3(xy.x + 5, xy.y);
        ImVec2 h4(plot.PlotRect.Max.x, xy.y);
        ImVec2 v1(xy.x, plot.PlotRect.Min.y);
        ImVec2 v2(xy.x, xy.y - 5);
        ImVec2 v3(xy.x, xy.y + 5);
        ImVec2 v4(xy.x, plot.PlotRect.Max.y);
        ImU32 col = GetStyleColorU32(ImPlotCol_Crosshairs);
        DrawList.AddLine(h1, h2, col);
        DrawList.AddLine(h3, h4, col);
        DrawList.AddLine(v1, v2, col);
        DrawList.AddLine(v3, v4, col);
    }

    // render mouse pos
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMousePos) && plot.PlotHovered) {
        char buffer[128] = {};
        ImBufferWriter writer(buffer, sizeof(buffer));
        // x
        if (ImHasFlag(plot.XAxis.Flags, ImPlotAxisFlags_Time)) {
            ImPlotTimeUnit unit = GetUnitForRange(plot.XAxis.Range.Size() / (plot.PlotRect.GetWidth() / 100));
            const int written = FormatDateTime(ImPlotTime::FromDouble(gp.MousePos[0].x), &writer.Buffer[writer.Pos], writer.Size - writer.Pos - 1, GetDateTimeFmt(TimeFormatMouseCursor, unit));
            if (written > 0)
                writer.Pos += ImMin(written, writer.Size - writer.Pos - 1);
        }
        else {
            writer.Write(GetFormatX(), RoundAxisValue(plot.XAxis, gp.XTicks, gp.MousePos[0].x));
        }
        // y1
        writer.Write(", ");
        writer.Write(GetFormatY(0), RoundAxisValue(plot.YAxis[0], gp.YTicks[0], gp.MousePos[0].y));
        // y2
        if (ImHasFlag(plot.Flags, ImPlotFlags_YAxis2)) {
            writer.Write(", (");
            writer.Write(GetFormatY(1), RoundAxisValue(plot.YAxis[1], gp.YTicks[1], gp.MousePos[1].y));
            writer.Write(")");
        }
        // y3
        if (ImHasFlag(plot.Flags, ImPlotFlags_YAxis3)) {
            writer.Write(", (");
            writer.Write(GetFormatY(2), RoundAxisValue(plot.YAxis[2], gp.YTicks[2], gp.MousePos[2].y));
            writer.Write(")");
        }
        const ImVec2 size = ImGui::CalcTextSize(buffer);
        const ImVec2 pos = GetLocationPos(plot.PlotRect, size, plot.MousePosLocation, gp.Style.MousePosPadding);
        DrawList.AddText(pos, GetStyleColorU32(ImPlotCol_InlayText), buffer);
    }
    PopPlotClipRect();

    // reset legend hovers
    plot.LegendHovered = false;
    for (int i = 0; i < plot.Items.GetBufSize(); ++i)
        plot.Items.GetByIndex(i)->LegendHovered = false;
    // render legend
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoLegend) && plot.GetLegendCount() > 0) {
        const ImVec2 legend_size = CalcLegendSize(plot, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, plot.LegendOrientation);
        const ImVec2 legend_pos  = GetLocationPos(plot.LegendOutside ? plot.FrameRect : plot.PlotRect,
                                                  legend_size,
                                                  plot.LegendLocation,
                                                  plot.LegendOutside ? gp.Style.PlotPadding : gp.Style.LegendPadding);
        plot.LegendRect = ImRect(legend_pos, legend_pos + legend_size);
        // test hover
        plot.LegendHovered = plot.FrameHovered && plot.LegendRect.Contains(IO.MousePos);

        if (plot.LegendOutside)
            ImGui::PushClipRect(plot.FrameRect.Min, plot.FrameRect.Max, true);
        else
            PushPlotClipRect();
        ImU32  col_bg      = GetStyleColorU32(ImPlotCol_LegendBg);
        ImU32  col_bd      = GetStyleColorU32(ImPlotCol_LegendBorder);
        DrawList.AddRectFilled(plot.LegendRect.Min, plot.LegendRect.Max, col_bg);
        DrawList.AddRect(plot.LegendRect.Min, plot.LegendRect.Max, col_bd);
        ShowLegendEntries(plot, plot.LegendRect, plot.LegendHovered, gp.Style.LegendInnerPadding, gp.Style.LegendSpacing, plot.LegendOrientation, DrawList);
        ImGui::PopClipRect();
    }
    else {
        plot.LegendRect = ImRect();
    }
    if (plot.LegendFlipSideNextFrame)  {
        plot.LegendOutside  = !plot.LegendOutside;
        plot.LegendFlipSideNextFrame = false;
    }

    // render border
    if (gp.Style.PlotBorderSize > 0)
        DrawList.AddRect(plot.PlotRect.Min, plot.PlotRect.Max, GetStyleColorU32(ImPlotCol_PlotBorder), 0, ImDrawFlags_RoundCornersAll, gp.Style.PlotBorderSize);

    // FIT DATA --------------------------------------------------------------
    const bool axis_equal = ImHasFlag(plot.Flags, ImPlotFlags_Equal);
    if (gp.FitThisFrame && (gp.VisibleItemCount > 0 || plot.Queried)) {
        if (gp.FitX) {
            const double ext_size = gp.ExtentsX.Size() * 0.5;
            gp.ExtentsX.Min -= ext_size * gp.Style.FitPadding.x;
            gp.ExtentsX.Max += ext_size * gp.Style.FitPadding.x;
            if (!plot.XAxis.IsLockedMin() && !ImNanOrInf(gp.ExtentsX.Min))
                plot.XAxis.Range.Min = (gp.ExtentsX.Min);
            if (!plot.XAxis.IsLockedMax() && !ImNanOrInf(gp.ExtentsX.Max))
                plot.XAxis.Range.Max = (gp.ExtentsX.Max);
            if (ImAlmostEqual(plot.XAxis.Range.Max, plot.XAxis.Range.Min))  {
                plot.XAxis.Range.Max += 0.5;
                plot.XAxis.Range.Min -= 0.5;
            }
            plot.XAxis.Constrain();
            if (axis_equal && !gp.FitY[0])
                plot.YAxis[0].SetAspect(plot.XAxis.GetAspect());
        }
        for (int i = 0; i < IMPLOT_Y_AXES; i++) {
            if (gp.FitY[i]) {
                const double ext_size = gp.ExtentsY[i].Size() * 0.5;
                gp.ExtentsY[i].Min -= ext_size * gp.Style.FitPadding.y;
                gp.ExtentsY[i].Max += ext_size * gp.Style.FitPadding.y;
                if (!plot.YAxis[i].IsLockedMin() && !ImNanOrInf(gp.ExtentsY[i].Min))
                    plot.YAxis[i].Range.Min = (gp.ExtentsY[i].Min);
                if (!plot.YAxis[i].IsLockedMax() && !ImNanOrInf(gp.ExtentsY[i].Max))
                    plot.YAxis[i].Range.Max = (gp.ExtentsY[i].Max);
                if (ImAlmostEqual(plot.YAxis[i].Range.Max, plot.YAxis[i].Range.Min)) {
                    plot.YAxis[i].Range.Max += 0.5;
                    plot.YAxis[i].Range.Min -= 0.5;
                }
                plot.YAxis[i].Constrain();
                if (i == 0 && axis_equal && !gp.FitX)
                    plot.XAxis.SetAspect(plot.YAxis[0].GetAspect());
            }
        }
        if (axis_equal && gp.FitX && gp.FitY[0]) {
            double aspect = ImMax(plot.XAxis.GetAspect(), plot.YAxis[0].GetAspect());
            plot.XAxis.SetAspect(aspect);
            plot.YAxis[0].SetAspect(aspect);
        }
    }

    // CONTEXT MENUS -----------------------------------------------------------

    // main ctx menu
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMenus) && plot.PlotHovered && IO.MouseReleased[gp.InputMap.ContextMenuButton] && !plot.LegendHovered && !plot.ContextLocked)
        ImGui::OpenPopup("##PlotContext");
    if (ImGui::BeginPopup("##PlotContext")) {
        ShowPlotContextMenu(plot);
        ImGui::EndPopup();
    }

    // x-axis ctx menu
    if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMenus) && plot.FrameHovered && plot.XAxis.ExtHovered && IO.MouseReleased[gp.InputMap.ContextMenuButton] && !plot.LegendHovered && !plot.ContextLocked)
        ImGui::OpenPopup("##XContext");
    if (ImGui::BeginPopup("##XContext")) {
        ImGui::Text("X-Axis"); ImGui::Separator();
        ShowAxisContextMenu(plot.XAxis, ImHasFlag(plot.Flags, ImPlotFlags_Equal) ? &plot.YAxis[0] : NULL, true);
        ImGui::EndPopup();
    }

    // y-axes ctx menus
    for (int i = 0; i < IMPLOT_Y_AXES; ++i) {
        ImGui::PushID(i);
        if (!ImHasFlag(plot.Flags, ImPlotFlags_NoMenus) && plot.FrameHovered && plot.YAxis[i].ExtHovered && IO.MouseReleased[gp.InputMap.ContextMenuButton] && !plot.LegendHovered && !plot.ContextLocked)
            ImGui::OpenPopup("##YContext");
        if (ImGui::BeginPopup("##YContext")) {
            if (i == 0) {
                ImGui::Text("Y-Axis"); ImGui::Separator();
            }
            else {
                ImGui::Text("Y-Axis %d", i + 1); ImGui::Separator();
            }
            ShowAxisContextMenu(plot.YAxis[i], (i == 0 && ImHasFlag(plot.Flags, ImPlotFlags_Equal)) ? &plot.XAxis : NULL, false);
            ImGui::EndPopup();
        }
        ImGui::PopID();
    }


    // LINKED AXES ------------------------------------------------------------

    PushLinkedAxis(plot.XAxis);
    for (int i = 0; i < IMPLOT_Y_AXES; ++i)
        PushLinkedAxis(plot.YAxis[i]);

    // CLEANUP ----------------------------------------------------------------

    // resset context locked flag
    if (plot.ContextLocked && IO.MouseReleased[gp.InputMap.BoxSelectButton])
        plot.ContextLocked = false;


    // reset the plot items for the next frame
    for (int i = 0; i < plot.Items.GetBufSize(); ++i) {
        plot.Items.GetByIndex(i)->SeenThisFrame = false;
    }

    // mark the plot as initialized, i.e. having made it through one frame completely
    plot.Initialized = true;

    // Pop ImGui::PushID at the end of BeginPlot
    ImGui::PopID();
    // Reset context for next plot
    Reset(GImPlot);
}